

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O3

void __thiscall
llvm::dwarf::CFIProgram::dump
          (CFIProgram *this,raw_ostream *OS,MCRegisterInfo *MRI,bool IsEH,uint IndentLevel)

{
  uint uVar1;
  pointer pIVar2;
  char *pcVar3;
  raw_ostream *this_00;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  Instruction *Instr;
  pointer Instr_00;
  uint uVar4;
  long lVar5;
  StringRef SVar6;
  
  Instr_00 = (this->Instructions).
             super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->Instructions).
           super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (Instr_00 != pIVar2) {
    do {
      uVar1 = *(uint *)Instr_00;
      __n = (ulong)uVar1 & 0xffffffffffffffc0;
      uVar4 = (uint)((byte)uVar1 & 0xc0);
      if ((uVar1 & 0xc0) == 0) {
        uVar4 = uVar1;
      }
      raw_ostream::indent(OS,IndentLevel * 2);
      SVar6 = CallFrameString(uVar4 & 0xff,this->Arch);
      this_00 = raw_ostream::operator<<(OS,SVar6);
      SVar6.Length = 1;
      SVar6.Data = ":";
      raw_ostream::operator<<(this_00,SVar6);
      __buf = extraout_RDX;
      if ((Instr_00->Ops).super_SmallVectorImpl<unsigned_long>.
          super_SmallVectorTemplateBase<unsigned_long,_true>.
          super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size != 0) {
        lVar5 = 0;
        do {
          __n = (size_t)IsEH;
          printOperand(this,OS,MRI,IsEH,Instr_00,(uint)lVar5,
                       *(uint64_t *)
                        ((long)(Instr_00->Ops).super_SmallVectorImpl<unsigned_long>.
                               super_SmallVectorTemplateBase<unsigned_long,_true>.
                               super_SmallVectorTemplateCommon<unsigned_long,_void>.
                               super_SmallVectorBase.BeginX + lVar5 * 8));
          lVar5 = lVar5 + 1;
          __buf = extraout_RDX_00;
        } while ((uint)lVar5 <
                 (Instr_00->Ops).super_SmallVectorImpl<unsigned_long>.
                 super_SmallVectorTemplateBase<unsigned_long,_true>.
                 super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size);
      }
      pcVar3 = OS->OutBufCur;
      if (pcVar3 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar3 + 1;
        *pcVar3 = '\n';
      }
      else {
        raw_ostream::write(OS,10,__buf,__n);
      }
      Instr_00 = Instr_00 + 1;
    } while (Instr_00 != pIVar2);
  }
  return;
}

Assistant:

void CFIProgram::dump(raw_ostream &OS, const MCRegisterInfo *MRI, bool IsEH,
                      unsigned IndentLevel) const {
  for (const auto &Instr : Instructions) {
    uint8_t Opcode = Instr.Opcode;
    if (Opcode & DWARF_CFI_PRIMARY_OPCODE_MASK)
      Opcode &= DWARF_CFI_PRIMARY_OPCODE_MASK;
    OS.indent(2 * IndentLevel);
    OS << CallFrameString(Opcode, Arch) << ":";
    for (unsigned i = 0; i < Instr.Ops.size(); ++i)
      printOperand(OS, MRI, IsEH, Instr, i, Instr.Ops[i]);
    OS << '\n';
  }
}